

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.hpp
# Opt level: O2

void __thiscall SudoMaker::ReGlob::reglob_error::reglob_error(reglob_error *this,string *str)

{
  *(undefined ***)this = &PTR__reglob_error_0011dbc8;
  (this->str_)._M_dataplus._M_p = (pointer)&(this->str_).field_2;
  (this->str_)._M_string_length = 0;
  (this->str_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->str_,(string *)str);
  return;
}

Assistant:

reglob_error(std::string str) {
			str_ = std::move(str);
		}